

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O0

TSNode * ts_tree_cursor_current_node(TSNode *__return_storage_ptr__,TSTreeCursor *_self)

{
  _Bool _Var1;
  undefined8 *puVar2;
  TSSymbol *pTVar3;
  TSSymbol *alias_sequence;
  TreeCursorEntry *parent_entry;
  TSSymbol alias_symbol;
  TreeCursorEntry *last_entry;
  TreeCursor *self;
  TSTreeCursor *_self_local;
  
  if (_self->context[0] <= _self->context[0] - 1) {
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/tree_cursor.c"
                  ,0xe3,"TSNode ts_tree_cursor_current_node(const TSTreeCursor *)");
  }
  puVar2 = (undefined8 *)((long)_self->id + (ulong)(_self->context[0] - 1) * 0x20);
  parent_entry._6_2_ = 0;
  if (((1 < _self->context[0]) &&
      (pTVar3 = ts_language_alias_sequence
                          (*(TSLanguage **)((long)_self->tree + 8),
                           (uint)*(ushort *)
                                  (**(long **)((long)_self->id +
                                              (ulong)(_self->context[0] - 2) * 0x20) + 0x4c)),
      pTVar3 != (TSSymbol *)0x0)) && (_Var1 = ts_subtree_extra(*(Subtree *)*puVar2), !_Var1)) {
    parent_entry._6_2_ = pTVar3[*(uint *)(puVar2 + 3)];
  }
  ts_node_new(__return_storage_ptr__,(TSTree *)_self->tree,(Subtree *)*puVar2,
              *(Length *)(puVar2 + 1),parent_entry._6_2_);
  return __return_storage_ptr__;
}

Assistant:

TSNode ts_tree_cursor_current_node(const TSTreeCursor *_self) {
  const TreeCursor *self = (const TreeCursor *)_self;
  TreeCursorEntry *last_entry = array_back(&self->stack);
  TSSymbol alias_symbol = 0;
  if (self->stack.size > 1) {
    TreeCursorEntry *parent_entry = &self->stack.contents[self->stack.size - 2];
    const TSSymbol *alias_sequence = ts_language_alias_sequence(
      self->tree->language,
      parent_entry->subtree->ptr->alias_sequence_id
    );
    if (alias_sequence && !ts_subtree_extra(*last_entry->subtree)) {
      alias_symbol = alias_sequence[last_entry->structural_child_index];
    }
  }
  return ts_node_new(
    self->tree,
    last_entry->subtree,
    last_entry->position,
    alias_symbol
  );
}